

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_char>::addHolesAtEnd
          (HoleSet<unsigned_char> *this,uchar lgSize,uchar offset,uchar limitLgSize)

{
  ulong uVar1;
  undefined7 in_register_00000009;
  uint uVar2;
  undefined3 in_register_00000031;
  
  uVar2 = (uint)offset;
  for (uVar1 = (ulong)CONCAT31(in_register_00000031,lgSize);
      uVar1 < (CONCAT71(in_register_00000009,limitLgSize) & 0xffffffff); uVar1 = uVar1 + 1) {
    this->holes[uVar1] = (uchar)uVar2;
    uVar2 = uVar2 + 1 >> 1;
  }
  return;
}

Assistant:

void addHolesAtEnd(UIntType lgSize, UIntType offset,
                       UIntType limitLgSize = sizeof(HoleSet::holes) / sizeof(HoleSet::holes[0])) {
      // Add new holes of progressively larger sizes in the range [lgSize, limitLgSize) starting
      // from the given offset.  The idea is that you just allocated an lgSize-sized field from
      // an limitLgSize-sized space, such as a newly-added word on the end of the data segment.

      KJ_DREQUIRE(limitLgSize <= kj::size(holes));

      while (lgSize < limitLgSize) {
        KJ_DREQUIRE(holes[lgSize] == 0);
        KJ_DREQUIRE(offset % 2 == 1);
        holes[lgSize] = offset;
        ++lgSize;
        offset = (offset + 1) / 2;
      }
    }